

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_shapes.cxx
# Opt level: O2

void __thiscall xray_re::xr_shape_object::load(xr_shape_object *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint __line;
  undefined8 in_RAX;
  size_t sVar2;
  char *__assertion;
  uint16_t version;
  
  version = (uint16_t)((ulong)in_RAX >> 0x30);
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,0,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x1a;
  }
  else if (version == 1) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar2 = xr_reader::find_chunk(r,1);
    if (sVar2 != 0) {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      xr_reader::
      r_seq<std::vector<xray_re::shape_def,std::allocator<xray_re::shape_def>>,read_shape>
                (r,*puVar1,&this->m_shapes);
      return;
    }
    __assertion = "0";
    __line = 0x1e;
  }
  else {
    __assertion = "version == SHAPE_VERSION";
    __line = 0x1b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_shapes.cxx"
                ,__line,"virtual void xray_re::xr_shape_object::load(xr_reader &)");
}

Assistant:

void xr_shape_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SHAPE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SHAPE_VERSION);
	xr_custom_object::load(r);
	if (!r.find_chunk(SHAPE_CHUNK_SHAPES))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_shapes, read_shape());
	r.debug_find_chunk();
}